

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O0

void __thiscall
duckdb::BinaryAggregateHeap<duckdb::string_t,_long,_duckdb::GreaterThan>::Insert
          (BinaryAggregateHeap<duckdb::string_t,_long,_duckdb::GreaterThan> *this,
          ArenaAllocator *allocator,string_t *key,long *value)

{
  bool bVar1;
  string_t *in_RCX;
  pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<long>_> *in_RDX;
  pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<long>_> *in_RSI;
  string_t *in_RDI;
  _func_bool_pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<long>_>_ptr_pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<long>_>_ptr
  *in_stack_00000040;
  pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<long>_> *in_stack_00000048;
  pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<long>_> *in_stack_00000050;
  string_t *in_stack_00000080;
  ArenaAllocator *in_stack_00000088;
  HeapEntry<duckdb::string_t> *in_stack_00000090;
  
  if (*(ulong *)&in_RDI[1].value < *(ulong *)&in_RDI->value) {
    HeapEntry<duckdb::string_t>::Assign(in_stack_00000090,in_stack_00000088,in_stack_00000080);
    HeapEntry<long>::Assign
              ((HeapEntry<long> *)
               ((in_RDI->value).pointer.ptr + *(long *)&in_RDI[1].value * 0x28 + 0x20),
               (ArenaAllocator *)in_RSI,(long *)in_RCX);
    *(long *)&in_RDI[1].value = *(long *)&in_RDI[1].value + 1;
    std::
    push_heap<std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<long>>*,bool(*)(std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<long>>const&,std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<long>>const&)>
              (in_stack_00000050,in_stack_00000048,in_stack_00000040);
  }
  else {
    bVar1 = GreaterThan::Operation<duckdb::string_t>(in_RCX,in_RDI);
    if (bVar1) {
      std::
      pop_heap<std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<long>>*,bool(*)(std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<long>>const&,std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<long>>const&)>
                (in_RSI,in_RDX,
                 (_func_bool_pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<long>_>_ptr_pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<long>_>_ptr
                  *)in_RCX);
      HeapEntry<duckdb::string_t>::Assign(in_stack_00000090,in_stack_00000088,in_stack_00000080);
      HeapEntry<long>::Assign
                ((HeapEntry<long> *)
                 ((in_RDI->value).pointer.ptr + (*(long *)&in_RDI[1].value + -1) * 0x28 + 0x20),
                 (ArenaAllocator *)in_RSI,(long *)in_RCX);
      std::
      push_heap<std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<long>>*,bool(*)(std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<long>>const&,std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<long>>const&)>
                (in_stack_00000050,in_stack_00000048,in_stack_00000040);
    }
  }
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}